

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

void swrenderer::R_DrawFogBoundary(int x1,int x2,short *uclip,short *dclip)

{
  double dVar1;
  uint uVar2;
  long *plVar3;
  SWORD *b2_1;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  short *psVar15;
  short sVar16;
  long lVar17;
  double dVar18;
  int xr;
  double local_70;
  uint local_68;
  int local_64;
  int y_1;
  int y;
  long local_58;
  short *local_50;
  short *local_48;
  long local_40;
  long local_38;
  
  plVar3 = basecolormap;
  dVar18 = (double)((float)(~x1 + x2) * rw_lightstep + rw_light);
  uVar9 = (uint)uclip[(long)x2 + -1];
  uVar4 = (uint)dclip[(long)x2 + -1];
  dVar1 = 24.0;
  if (dVar18 <= 24.0) {
    dVar1 = dVar18;
  }
  iVar12 = wallshade - SUB84(dVar1 + 103079215104.0,0) >> 0x10;
  if (0x1e < iVar12) {
    iVar12 = 0x1f;
  }
  if (iVar12 < 1) {
    iVar12 = 0;
  }
  local_58 = *basecolormap;
  if (uclip[(long)x2 + -1] < dclip[(long)x2 + -1]) {
    for (uVar10 = 0; uVar4 - uVar9 != uVar10; uVar10 = uVar10 + 1) {
      spanend[(long)(int)uVar9 + uVar10] = (short)x2 + -1;
    }
  }
  drawerargs::dc_colormap = local_58 + (ulong)(uint)(iVar12 << 8);
  lVar11 = (ulong)(uint)(iVar12 << 8) + *plVar3;
  local_38 = (long)x1;
  local_50 = uclip;
  local_48 = dclip;
  for (lVar17 = (long)(x2 + -2); local_38 <= lVar17; lVar17 = lVar17 + -1) {
    uVar8 = (uint)uclip[lVar17];
    uVar13 = (uint)dclip[lVar17];
    xr = (int)lVar17 + 1;
    dVar18 = dVar18 - (double)rw_lightstep;
    dVar1 = dVar18;
    if (24.0 <= dVar18) {
      dVar1 = 24.0;
    }
    iVar5 = SUB84(dVar1 + 103079215104.0,0);
    iVar14 = wallshade - iVar5 >> 0x10;
    if (0x1e < iVar14) {
      iVar14 = 0x1f;
    }
    if (iVar14 < 1) {
      iVar14 = 0;
    }
    sVar16 = (short)lVar17;
    if (iVar14 == iVar12) {
      uVar2 = uVar4;
      if ((int)uVar8 < (int)uVar4) {
        uVar2 = uVar8;
      }
      if (lVar11 == local_58) {
        uVar6 = uVar2;
        if ((int)uVar2 < (int)uVar9) {
          uVar6 = uVar9;
        }
        uVar9 = uVar6;
        if ((int)uVar6 < (int)uVar13) {
          uVar9 = uVar13;
        }
        uVar10 = (ulong)uVar9;
        if ((int)uVar4 < (int)uVar9) {
          uVar10 = (ulong)uVar4;
        }
      }
      else {
        lVar7 = (long)(int)uVar9;
        psVar15 = spanend + lVar7;
        local_70 = dVar18;
        local_68 = uVar8;
        local_64 = iVar12;
        local_40 = lVar11;
        for (; uVar6 = (uint)lVar7, lVar7 < (int)uVar2; lVar7 = lVar7 + 1) {
          y = uVar6;
          DrawerCommandQueue::
          QueueCommand<swrenderer::DrawFogBoundaryLinePalCommand,int&,int_const&,short&>
                    (&y,&xr,psVar15);
          psVar15 = psVar15 + 1;
        }
        uVar9 = uVar6;
        if ((int)uVar6 < (int)uVar13) {
          uVar9 = uVar13;
        }
        uVar10 = (ulong)(int)uVar4;
        psVar15 = spanend + uVar10;
        while (psVar15 = psVar15 + -1, lVar11 = local_40, uclip = local_50, dclip = local_48,
              dVar18 = local_70, uVar8 = local_68, iVar12 = local_64,
              (long)(int)uVar9 < (long)uVar10) {
          uVar10 = uVar10 - 1;
          y_1 = (int)uVar10;
          DrawerCommandQueue::
          QueueCommand<swrenderer::DrawFogBoundaryLinePalCommand,int&,int_const&,short&>
                    (&y_1,&xr,psVar15);
        }
      }
      uVar4 = uVar13;
      if ((int)uVar6 < (int)uVar13) {
        uVar4 = uVar6;
      }
      for (lVar7 = (long)(int)uVar8; lVar7 < (int)uVar4; lVar7 = lVar7 + 1) {
        spanend[lVar7] = sVar16;
      }
      if ((int)uVar6 < (int)(uint)uVar10) {
        uVar6 = (uint)uVar10;
      }
      for (lVar7 = (long)(int)uVar13; (int)uVar6 < lVar7; lVar7 = lVar7 + -1) {
        *(short *)(&DAT_017840ce + lVar7 * 2) = sVar16;
      }
    }
    else {
      if (((int)uVar9 < (int)uVar4) && (iVar12 != 0)) {
        local_70 = dVar18;
        R_DrawFogBoundarySection(uVar9,uVar4,xr);
        uclip = local_50;
        dclip = local_48;
        dVar18 = local_70;
      }
      if ((int)uVar9 < (int)uVar8) {
        uVar8 = uVar9;
      }
      if ((int)uVar13 < (int)uVar4) {
        uVar13 = uVar4;
      }
      if (uVar13 - uVar8 != 0 && (int)uVar8 <= (int)uVar13) {
        for (uVar10 = 0; uVar13 - uVar8 != uVar10; uVar10 = uVar10 + 1) {
          spanend[(long)(int)uVar8 + uVar10] = sVar16;
        }
      }
      dVar1 = (double)(float)dVar18;
      if (24.0 <= dVar1) {
        dVar1 = 24.0;
      }
      iVar12 = wallshade - SUB84(dVar1 + 103079215104.0,0) >> 0x10;
      if (0x1e < iVar12) {
        iVar12 = 0x1f;
      }
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      drawerargs::dc_colormap = (ulong)(uint)(iVar12 << 8) + *basecolormap;
      iVar12 = wallshade - iVar5 >> 0x10;
      if (0x1e < iVar12) {
        iVar12 = 0x1f;
      }
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      lVar11 = (ulong)(uint)(iVar12 << 8) + *basecolormap;
      iVar12 = iVar14;
    }
    uVar9 = (uint)uclip[lVar17];
    uVar4 = (uint)dclip[lVar17];
  }
  if (((int)uVar9 < (int)uVar4) && (iVar12 != 0)) {
    R_DrawFogBoundarySection(uVar9,uVar4,x1);
  }
  return;
}

Assistant:

void R_DrawFogBoundary(int x1, int x2, short *uclip, short *dclip)
	{
		// This is essentially the same as R_MapVisPlane but with an extra step
		// to create new horizontal spans whenever the light changes enough that
		// we need to use a new colormap.

		double lightstep = rw_lightstep;
		double light = rw_light + rw_lightstep*(x2 - x1 - 1);
		int x = x2 - 1;
		int t2 = uclip[x];
		int b2 = dclip[x];
		int rcolormap = GETPALOOKUP(light, wallshade);
		int lcolormap;
		uint8_t *basecolormapdata = basecolormap->Maps;

		if (b2 > t2)
		{
			fillshort(spanend + t2, b2 - t2, x);
		}

		R_SetColorMapLight(basecolormap->Maps, (float)light, wallshade);

		uint8_t *fake_dc_colormap = basecolormap->Maps + (GETPALOOKUP(light, wallshade) << COLORMAPSHIFT);

		for (--x; x >= x1; --x)
		{
			int t1 = uclip[x];
			int b1 = dclip[x];
			const int xr = x + 1;
			int stop;

			light -= rw_lightstep;
			lcolormap = GETPALOOKUP(light, wallshade);
			if (lcolormap != rcolormap)
			{
				if (t2 < b2 && rcolormap != 0)
				{ // Colormap 0 is always the identity map, so rendering it is
				  // just a waste of time.
					R_DrawFogBoundarySection(t2, b2, xr);
				}
				if (t1 < t2) t2 = t1;
				if (b1 > b2) b2 = b1;
				if (t2 < b2)
				{
					fillshort(spanend + t2, b2 - t2, x);
				}
				rcolormap = lcolormap;
				R_SetColorMapLight(basecolormap->Maps, (float)light, wallshade);
				fake_dc_colormap = basecolormap->Maps + (GETPALOOKUP(light, wallshade) << COLORMAPSHIFT);
			}
			else
			{
				if (fake_dc_colormap != basecolormapdata)
				{
					stop = MIN(t1, b2);
					while (t2 < stop)
					{
						int y = t2++;
						DrawerCommandQueue::QueueCommand<DrawFogBoundaryLinePalCommand>(y, xr, spanend[y]);
					}
					stop = MAX(b1, t2);
					while (b2 > stop)
					{
						int y = --b2;
						DrawerCommandQueue::QueueCommand<DrawFogBoundaryLinePalCommand>(y, xr, spanend[y]);
					}
				}
				else
				{
					t2 = MAX(t2, MIN(t1, b2));
					b2 = MIN(b2, MAX(b1, t2));
				}

				stop = MIN(t2, b1);
				while (t1 < stop)
				{
					spanend[t1++] = x;
				}
				stop = MAX(b2, t2);
				while (b1 > stop)
				{
					spanend[--b1] = x;
				}
			}

			t2 = uclip[x];
			b2 = dclip[x];
		}
		if (t2 < b2 && rcolormap != 0)
		{
			R_DrawFogBoundarySection(t2, b2, x1);
		}
	}